

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O2

void show_inven(wchar_t mode,item_tester tester)

{
  object **list;
  wchar_t wVar1;
  wchar_t wVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  
  wVar1 = weight_remaining(player);
  wipe_obj_list();
  if ((mode & 1U) != L'\0') {
    lVar3 = (long)player->upkeep->total_weight;
    wVar2 = -wVar1;
    if (L'\0' < wVar1) {
      wVar2 = wVar1;
    }
    pcVar6 = "remaining";
    if (wVar1 < L'\0') {
      pcVar6 = "overweight";
    }
    strnfmt(items[num_obj].label,0x50,"Burden %d.%d lb (%d.%d lb %s) ",lVar3 / 10 & 0xffffffff,
            lVar3 % 10 & 0xffffffff,(ulong)(uint)wVar2 / 10,(ulong)(uint)wVar2 % 10,pcVar6);
    lVar3 = (long)num_obj;
    num_obj = num_obj + L'\x01';
    items[lVar3].object = (object *)0x0;
  }
  list = player->upkeep->inven;
  uVar5 = 0xffffffffffffffff;
  for (uVar4 = 0; z_info->pack_size != uVar4; uVar4 = uVar4 + 1) {
    if (list[uVar4] != (object *)0x0) {
      uVar5 = uVar4;
    }
    uVar5 = uVar5 & 0xffffffff;
  }
  build_obj_list((wchar_t)uVar5,list,tester,mode);
  num_head = mode & 1U;
  show_obj_list(mode);
  return;
}

Assistant:

void show_inven(int mode, item_tester tester)
{
	int i, last_slot = -1;
	int diff = weight_remaining(player);

	bool in_term = (mode & OLIST_WINDOW) ? true : false;

	/* Initialize */
	wipe_obj_list();

	/* Include burden for term windows */
	if (in_term) {
		strnfmt(items[num_obj].label, sizeof(items[num_obj].label),
		        "Burden %d.%d lb (%d.%d lb %s) ",
		        player->upkeep->total_weight / 10,
				player->upkeep->total_weight % 10,
		        abs(diff) / 10, abs(diff) % 10,
		        (diff < 0 ? "overweight" : "remaining"));

		items[num_obj].object = NULL;
		num_obj++;
	}

	/* Find the last occupied inventory slot */
	for (i = 0; i < z_info->pack_size; i++)
		if (player->upkeep->inven[i] != NULL) last_slot = i;

	/* Build the object list */
	build_obj_list(last_slot, player->upkeep->inven, tester, mode);

	/* Term window starts with a burden header */
	num_head = in_term ? 1 : 0;

	/* Display the object list */
	show_obj_list(mode);
}